

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O3

BigInt * __thiscall
BigInt::karatsuba(BigInt *__return_storage_ptr__,BigInt *this,BigInt *a,BigInt *b)

{
  uint uVar1;
  uint uVar2;
  BigInt z1;
  BigInt cc;
  BigInt aa;
  BigInt z2;
  BigInt z0;
  BigInt dd;
  BigInt bb;
  BigInt local_198;
  BigInt *local_178;
  BigInt local_170;
  BigInt local_150;
  BigInt local_130;
  BigInt local_110;
  BigInt local_f0;
  BigInt local_d0;
  BigInt local_b0;
  BigInt local_90;
  BigInt local_70;
  BigInt local_50;
  
  uVar1 = get_real_length(a);
  uVar2 = get_real_length(b);
  if ((int)(uVar1 - uVar2) < 0xb && (499 < (int)uVar2 && 499 < (int)uVar1)) {
    if (uVar2 < uVar1) {
      uVar1 = uVar2;
    }
    uVar2 = uVar1 >> 1;
    local_178 = __return_storage_ptr__;
    sub_value(&local_b0,a,1,uVar2);
    sub_value(&local_130,a,uVar2 + 1,-1);
    sub_value(&local_d0,b,1,uVar2);
    sub_value(&local_150,b,uVar2 + 1,-1);
    karatsuba(&local_110,this,&local_130,&local_150);
    karatsuba(&local_f0,this,&local_b0,&local_d0);
    add(&local_50,&local_130,&local_b0);
    operator=(&local_130,&local_50);
    if (local_50.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_50.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    add(&local_70,&local_150,&local_d0);
    operator=(&local_150,&local_70);
    if (local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    karatsuba(&local_170,this,&local_130,&local_150);
    operator-(&local_198,&local_170,&local_f0);
    operator-(&local_90,&local_198,&local_110);
    operator=(&local_170,&local_90);
    if (local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((void *)CONCAT44(local_198.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_198.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_198.value.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_198.value.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    local_198.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_insert
              (&local_110.value,
               (iterator)
               (local_110.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1),(ulong)(uVar1 & 0x7ffffffe),
               (value_type_conflict2 *)&local_198);
    local_198.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_insert
              (&local_170.value,
               (iterator)
               (local_170.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1),(ulong)uVar2,
               (value_type_conflict2 *)&local_198);
    add(&local_198,&local_110,&local_170);
    __return_storage_ptr__ = local_178;
    add(local_178,&local_198,&local_f0);
    if ((void *)CONCAT44(local_198.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_198.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_198.value.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_198.value.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (local_170.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_110.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_150.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_130.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    simple_multiply(__return_storage_ptr__,a,b);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::karatsuba(BigInt& a, BigInt& b) {
    int len_a = a.get_real_length();
    int len_b = b.get_real_length();
    if (len_a < 500 || len_b < 500 || (len_a - len_b) > 10) {
        return a.simple_multiply(b);
    }
    int half = min(len_a, len_b) / 2;

    BigInt bb = a.sub_value(1, half);
    BigInt aa = a.sub_value(half + 1, -1);
    BigInt dd = b.sub_value(1, half);
    BigInt cc = b.sub_value(half + 1, -1);

    BigInt z2 = this->karatsuba(aa, cc);
    BigInt z0 = this->karatsuba(bb, dd);
    aa = aa + bb;
    cc = cc + dd;
    BigInt z1 = this->karatsuba(aa, cc);
    z1 = z1 - z0 - z2;

    z2.value.insert(z2.value.begin() + 1, 2 * half, 0);
    z1.value.insert(z1.value.begin() + 1, half, 0);

    return z2 + z1 + z0;
    ;
}